

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::Passed(UnitTestImpl *this)

{
  bool bVar1;
  
  bVar1 = Failed(this);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool Passed() const { return !Failed(); }